

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.cpp
# Opt level: O2

void puppup::movegen::__impl::gen
               (Rack *r,idx step,idx cursor,idx orig_cursor,nodeid node,Gaddag *gaddag,State *state,
               idx non_multipliable_score,idx multipliable_score,idx word_mult,
               vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> *outputs,
               bool best_only,array<long,_16384UL> *orthogonal_memo,idx blanks,idx placed)

{
  pointer pMVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  Rack *pRVar5;
  bool best_only_local;
  idx *local_110;
  ulong local_108;
  idx local_100;
  idx local_f8;
  ulong local_f0;
  long local_e8;
  long local_e0;
  nodeid node_local;
  idx word_mult_new;
  idx orig_cursor_local;
  idx cursor_local;
  idx step_local;
  anon_class_128_16_5f1c26f7 evaluate;
  
  bVar3 = best_only;
  local_110 = (idx *)blanks;
  local_100 = multipliable_score;
  best_only_local = best_only;
  local_108 = placed;
  local_f8 = non_multipliable_score;
  local_f0 = (ulong)best_only;
  local_e8 = orig_cursor;
  node_local = node;
  orig_cursor_local = orig_cursor;
  cursor_local = cursor;
  step_local = step;
  if (step < 0 && cursor != orig_cursor) {
    if (((gaddag->nodes_).
         super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
         ._M_impl.super__Vector_impl_data._M_start[node].children._M_elems[0x1f] != -1) &&
       ((bVar3 = edge(cursor), bVar3 || ((state->board)._M_elems[cursor] == 0x1b)))) {
      gen(r,-step,local_e8 - step,local_e8,
          (gaddag->nodes_).
          super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
          ._M_impl.super__Vector_impl_data._M_start[node].children._M_elems[0x1f],gaddag,state,
          local_f8,local_100,word_mult,outputs,SUB81(local_f0,0),orthogonal_memo,(idx)local_110,
          local_108);
    }
  }
  else if (((0 < step && 0 < placed) &&
           ((gaddag->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start[node] != -1)) &&
          ((bVar4 = edge(cursor), bVar4 || ((state->board)._M_elems[cursor] == 0x1b)))) {
    lVar2 = local_100 * word_mult + 0x23;
    if (local_108 < 7) {
      lVar2 = local_100 * word_mult;
    }
    pRVar5 = (Rack *)(lVar2 + local_f8);
    if ((bVar3) &&
       (pMVar1 = (outputs->
                 super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>).
                 _M_impl.super__Vector_impl_data._M_finish,
       (outputs->super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>).
       _M_impl.super__Vector_impl_data._M_start != pMVar1)) {
      if (pMVar1[-1].score < (long)pRVar5) {
        lVar2 = (gaddag->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start[node];
        pMVar1[-1].score = (idx)pRVar5;
        pMVar1[-1].word = lVar2;
        pMVar1[-1].cursor = cursor;
        pMVar1[-1].step = step;
        pMVar1[-1].blanks = (idx)local_110;
      }
    }
    else {
      evaluate.state =
           (State *)(gaddag->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start[node];
      evaluate.blanks = local_110;
      evaluate.r = pRVar5;
      evaluate.cursor = (idx *)cursor;
      evaluate.j = (chr *)step;
      std::vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>::
      emplace_back<puppup::movegen::Move>(outputs,(Move *)&evaluate);
    }
  }
  bVar3 = edge(cursor);
  if (!bVar3) {
    lVar2 = (state->board)._M_elems[cursor];
    if (lVar2 == 0x1b) {
      word_mult_new = word_mult * *(long *)(board::word_multiplier + cursor * 8);
      for (local_e0 = 0; local_e0 < 0x1b; local_e0 = local_e0 + 1) {
        if ((gaddag->nodes_).
            super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
            ._M_impl.super__Vector_impl_data._M_start[node_local].children._M_elems[local_e0] != -1)
        {
          evaluate.cursor = &cursor_local;
          evaluate.j = &local_e0;
          evaluate.state = state;
          evaluate.blanks = &blanks;
          evaluate.step = &step_local;
          evaluate.orthogonal_memo = orthogonal_memo;
          evaluate.orig_cursor = &orig_cursor_local;
          evaluate.node = &node_local;
          evaluate.non_multipliable_score = &non_multipliable_score;
          evaluate.word_mult_new = &word_mult_new;
          evaluate.outputs = outputs;
          evaluate.r = r;
          evaluate.gaddag = gaddag;
          evaluate.multipliable_score = &multipliable_score;
          evaluate.best_only = &best_only_local;
          evaluate.placed = &placed;
          if (r->_M_elems[local_e0] != 0) {
            gen::anon_class_128_16_5f1c26f7::operator()(&evaluate,local_e0);
          }
          if (r->_M_elems[0x1a] != 0) {
            gen::anon_class_128_16_5f1c26f7::operator()(&evaluate,0x1a);
          }
        }
      }
    }
    else {
      lVar2 = (gaddag->nodes_).
              super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
              ._M_impl.super__Vector_impl_data._M_start[node].children._M_elems[lVar2];
      if (lVar2 != -1) {
        gen(r,step,step + cursor,local_e8,lVar2,gaddag,state,local_f8,
            local_100 + (state->letter_score)._M_elems[cursor],word_mult,outputs,SUB81(local_f0,0),
            orthogonal_memo,(idx)local_110,local_108);
      }
    }
  }
  return;
}

Assistant:

void gen(Rack& r, idx step, idx cursor, idx orig_cursor, trie::nodeid node,
         const trie::Gaddag& gaddag, board::State& state,
         idx non_multipliable_score, idx multipliable_score, idx word_mult,
         std::vector<Move>& outputs, const bool best_only,
         std::array<idx, 256 * 32 * 2>& orthogonal_memo, idx blanks,
         idx placed) {
    // we have gone far enough in the reverse direction, time to turn around
    if (cursor != orig_cursor && step < 0 &&
        (gaddag.has(node, trie::rev_marker) &&
         (edge(cursor) || state.board[cursor] == emptiness))) {
        gen(r, -step, orig_cursor - step, orig_cursor,
            gaddag.get(node, trie::rev_marker), gaddag, state,
            non_multipliable_score, multipliable_score, word_mult, outputs,
            best_only, orthogonal_memo, blanks, placed);
    }
    // we have found a valid word
    if (placed > 0 && step > 0 && gaddag.exists(node) &&
        (edge(cursor) || state.board[cursor] == emptiness)) {
        idx score = non_multipliable_score + multipliable_score * word_mult;
        if (placed >= 7) score += bingo_bonus;
        if (!best_only || outputs.empty()) {
            outputs.push_back(
                {score, gaddag.nodeToWord(node), cursor, step, blanks});
        } else {
            if (score > outputs.back().score) {
                outputs.back() = {score, gaddag.nodeToWord(node), cursor, step,
                                  blanks};
            }
        }
    }
    // we have gone out of bounds
    if (edge(cursor)) {
        return;
    }
    // traverse over undiscovered land
    if (state.board[cursor] == emptiness) {
        idx word_mult_new = word_mult * board::word_multiplier[cursor];
        /*
        for (trie::nodeid child = gaddag.firstChild(node);
             child != trie::invalid; child = gaddag.nextSibling(child)) {
            chr j = gaddag.val(child);
            if (j >= emptiness) break;
            */
        for (chr j = 0; j < emptiness; ++j) {
            if (!gaddag.has(node, j)) continue;
            auto evaluate = [&](const chr i) {
                --r[i];
                state.board[cursor] = j;
                state.letter_score[cursor] = scores[i];
                idx newblanks = blanks;
                idx blankness = 0;
                if (i == blank) {
                    blankness = 1;
                    newblanks <<= idx(16LL);
                    newblanks |= cursor + 1;
                }
                idx orth_score =
                    orthogonal_memo[2 * (cursor * 32 + j) + blankness];
                if (orth_score == -2) {
                    orth_score = orthogonal(turn(step), cursor, gaddag, state);
                    orthogonal_memo[2 * (cursor * 32 + j) + blankness] =
                        orth_score;
                }
                if (orth_score >= 0) {
                    gen(r, step, cursor + step, orig_cursor,
                        gaddag.get(node, j), gaddag, state,
                        non_multipliable_score + orth_score,
                        multipliable_score +
                            scores[i] * board::letter_multiplier[cursor],
                        word_mult_new, outputs, best_only, orthogonal_memo,
                        newblanks, placed + 1);
                }
                state.board[cursor] = emptiness;
                state.letter_score[cursor] = 0;
                ++r[i];
            };
            if (r[j]) evaluate(j);
            if (r[blank]) evaluate(blank);
        }
    } else {
        // traverse over existing tiles
        const chr i = state.board[cursor];
        if (gaddag.has(node, i)) {
            gen(r, step, cursor + step, orig_cursor, gaddag.get(node, i),
                gaddag, state, non_multipliable_score,
                multipliable_score + state.letter_score[cursor], word_mult,
                outputs, best_only, orthogonal_memo, blanks, placed);
        }
    }
}